

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O1

size_t FSE_normalizeCount(short *normalizedCounter,uint tableLog,uint *count,size_t total,
                         uint maxSymbolValue,uint useLowProbCount)

{
  uint uVar1;
  undefined1 auVar2 [16];
  char cVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  ushort uVar8;
  bool bVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ushort uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  U64 vStepLog;
  
  uVar10 = 0xb;
  if (tableLog != 0) {
    uVar10 = (ulong)tableLog;
  }
  uVar19 = (uint)uVar10;
  if (uVar19 < 5) {
    return 0xffffffffffffffff;
  }
  if (0xc < uVar19) {
    return 0xffffffffffffffd4;
  }
  uVar5 = FSE_minTableLog(total,maxSymbolValue);
  if (uVar19 < uVar5) {
    return 0xffffffffffffffff;
  }
  uVar14 = -(ushort)(useLowProbCount != 0) | 1;
  bVar4 = (byte)uVar10;
  cVar3 = -bVar4;
  bVar7 = cVar3 + 0x3e;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = total & 0xffffffff;
  iVar17 = 1 << (bVar4 & 0x1f);
  uVar6 = 0;
  uVar19 = 0;
  uVar5 = 0;
  iVar18 = iVar17;
  do {
    uVar13 = (ulong)count[uVar5];
    if (uVar13 == total) {
      return 0;
    }
    uVar15 = (uint)(total >> (bVar4 & 0x3f));
    if (uVar13 == 0) {
      normalizedCounter[uVar5] = 0;
    }
    else if (uVar15 < count[uVar5]) {
      uVar13 = uVar13 * SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x4000000000000000)) / auVar2,0);
      uVar12 = uVar13 >> (bVar7 & 0x3f);
      if ((uVar12 & 0xfff8) == 0) {
        uVar12 = (ulong)((int)uVar12 +
                        (uint)((ulong)FSE_normalizeCount::rtbTable[uVar12 & 0xffff] <<
                               (cVar3 + 0x2aU & 0x3f) <
                              uVar13 - ((uVar12 & 0xffff) << (bVar7 & 0x3f))));
      }
      uVar8 = (ushort)uVar12;
      if ((ushort)uVar6 < uVar8) {
        uVar19 = uVar5;
      }
      if ((ushort)uVar6 < uVar8) {
        uVar6 = uVar12 & 0xffff;
      }
      normalizedCounter[uVar5] = uVar8;
      iVar18 = iVar18 - (int)(uVar12 & 0xffff);
    }
    else {
      normalizedCounter[uVar5] = uVar14;
      iVar18 = iVar18 + -1;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 <= maxSymbolValue);
  iVar11 = (int)normalizedCounter[uVar19] >> 1;
  if (iVar11 != -iVar18 && SBORROW4(iVar11,-iVar18) == iVar11 + iVar18 < 0) {
    normalizedCounter[uVar19] = normalizedCounter[uVar19] + (short)iVar18;
    return uVar10;
  }
  uVar13 = total * 3 >> (bVar4 + 1 & 0x3f);
  uVar19 = maxSymbolValue + 1;
  uVar12 = (ulong)(maxSymbolValue + 1 + (uint)(uVar19 == 0));
  uVar6 = 0;
  uVar5 = 0;
  do {
    uVar1 = count[uVar6];
    if ((ulong)uVar1 == 0) {
      normalizedCounter[uVar6] = 0;
    }
    else {
      if (uVar15 < uVar1) {
        if ((uint)uVar13 < uVar1) {
          normalizedCounter[uVar6] = -2;
          goto LAB_007d78a9;
        }
        normalizedCounter[uVar6] = 1;
      }
      else {
        normalizedCounter[uVar6] = uVar14;
      }
      uVar5 = uVar5 + 1;
      total = total - uVar1;
    }
LAB_007d78a9:
    uVar6 = uVar6 + 1;
  } while (uVar12 != uVar6);
  uVar15 = iVar17 - uVar5;
  if (uVar15 != 0) {
    if ((uVar13 & 0xffffffff) < total / uVar15) {
      uVar6 = total * 3;
      uVar13 = 0;
      do {
        if ((normalizedCounter[uVar13] == -2) &&
           (uVar1 = count[uVar13], uVar1 <= (uint)(uVar6 / (uVar15 * 2)))) {
          normalizedCounter[uVar13] = 1;
          uVar5 = uVar5 + 1;
          total = total - uVar1;
        }
        uVar13 = uVar13 + 1;
      } while (uVar12 != uVar13);
      uVar15 = iVar17 - uVar5;
    }
    if (uVar5 != uVar19) {
      if (total == 0) {
        uVar6 = 0;
        if (uVar15 != 0) {
          uVar13 = 0;
          do {
            if (0 < normalizedCounter[uVar13]) {
              uVar15 = uVar15 - 1;
              normalizedCounter[uVar13] = normalizedCounter[uVar13] + 1;
            }
            uVar13 = (ulong)((int)uVar13 + 1) % (ulong)uVar19;
          } while (uVar15 != 0);
        }
      }
      else {
        uVar13 = ~(-1L << (cVar3 + 0x3dU & 0x3f));
        uVar6 = ((ulong)uVar15 << (bVar7 & 0x3f)) + uVar13;
        uVar19 = 0;
        bVar9 = true;
        do {
          if (normalizedCounter[uVar19] == -2) {
            uVar12 = uVar13 >> (bVar7 & 0x3f);
            uVar13 = (ulong)count[uVar19] * (uVar6 / (total & 0xffffffff)) + uVar13;
            uVar16 = uVar13 >> (bVar7 & 0x3f);
            if (uVar16 == uVar12) break;
            normalizedCounter[uVar19] = (short)uVar16 - (short)uVar12;
          }
          uVar19 = uVar19 + 1;
          bVar9 = uVar19 <= maxSymbolValue;
        } while (uVar19 <= maxSymbolValue);
        uVar6 = -(ulong)bVar9;
      }
      goto LAB_007d79dc;
    }
    uVar13 = 0;
    uVar19 = 0;
    uVar6 = 0;
    do {
      if (uVar19 < count[uVar13]) {
        uVar6 = uVar13 & 0xffffffff;
        uVar19 = count[uVar13];
      }
      uVar13 = uVar13 + 1;
    } while (uVar12 != uVar13);
    normalizedCounter[uVar6] = normalizedCounter[uVar6] + (short)uVar15;
  }
  uVar6 = 0;
LAB_007d79dc:
  if (0xffffffffffffff88 < uVar6) {
    uVar10 = uVar6;
  }
  return uVar10;
}

Assistant:

size_t FSE_normalizeCount (short* normalizedCounter, unsigned tableLog,
                           const unsigned* count, size_t total,
                           unsigned maxSymbolValue, unsigned useLowProbCount)
{
    /* Sanity checks */
    if (tableLog==0) tableLog = FSE_DEFAULT_TABLELOG;
    if (tableLog < FSE_MIN_TABLELOG) return ERROR(GENERIC);   /* Unsupported size */
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);   /* Unsupported size */
    if (tableLog < FSE_minTableLog(total, maxSymbolValue)) return ERROR(GENERIC);   /* Too small tableLog, compression potentially impossible */

    {   static U32 const rtbTable[] = {     0, 473195, 504333, 520860, 550000, 700000, 750000, 830000 };
        short const lowProbCount = useLowProbCount ? -1 : 1;
        U64 const scale = 62 - tableLog;
        U64 const step = ZSTD_div64((U64)1<<62, (U32)total);   /* <== here, one division ! */
        U64 const vStep = 1ULL<<(scale-20);
        int stillToDistribute = 1<<tableLog;
        unsigned s;
        unsigned largest=0;
        short largestP=0;
        U32 lowThreshold = (U32)(total >> tableLog);

        for (s=0; s<=maxSymbolValue; s++) {
            if (count[s] == total) return 0;   /* rle special case */
            if (count[s] == 0) { normalizedCounter[s]=0; continue; }
            if (count[s] <= lowThreshold) {
                normalizedCounter[s] = lowProbCount;
                stillToDistribute--;
            } else {
                short proba = (short)((count[s]*step) >> scale);
                if (proba<8) {
                    U64 restToBeat = vStep * rtbTable[proba];
                    proba += (count[s]*step) - ((U64)proba<<scale) > restToBeat;
                }
                if (proba > largestP) { largestP=proba; largest=s; }
                normalizedCounter[s] = proba;
                stillToDistribute -= proba;
        }   }
        if (-stillToDistribute >= (normalizedCounter[largest] >> 1)) {
            /* corner case, need another normalization method */
            size_t const errorCode = FSE_normalizeM2(normalizedCounter, tableLog, count, total, maxSymbolValue, lowProbCount);
            if (FSE_isError(errorCode)) return errorCode;
        }
        else normalizedCounter[largest] += (short)stillToDistribute;
    }

#if 0
    {   /* Print Table (debug) */
        U32 s;
        U32 nTotal = 0;
        for (s=0; s<=maxSymbolValue; s++)
            RAWLOG(2, "%3i: %4i \n", s, normalizedCounter[s]);
        for (s=0; s<=maxSymbolValue; s++)
            nTotal += abs(normalizedCounter[s]);
        if (nTotal != (1U<<tableLog))
            RAWLOG(2, "Warning !!! Total == %u != %u !!!", nTotal, 1U<<tableLog);
        getchar();
    }
#endif

    return tableLog;
}